

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder capnp::DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Builder *builder)

{
  char *pcVar1;
  uchar *puVar2;
  Builder BVar3;
  Fault f;
  Fault local_18;
  
  if (builder->type == TEXT) {
    puVar2 = (uchar *)(builder->field_1).textValue.content.ptr;
    pcVar1 = (char *)((builder->field_1).textValue.content.size_ - 1);
  }
  else if (builder->type == DATA) {
    puVar2 = (uchar *)(builder->field_1).intValue;
    pcVar1 = (builder->field_1).textValue.content.ptr;
  }
  else {
    puVar2 = (uchar *)0x0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x740,FAILED,"builder.type == DATA","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::~Fault(&local_18);
    pcVar1 = (char *)0x0;
  }
  BVar3.super_ArrayPtr<unsigned_char>.size_ = (size_t)pcVar1;
  BVar3.super_ArrayPtr<unsigned_char>.ptr = puVar2;
  return (Builder)BVar3.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder DynamicValue::Builder::AsImpl<Data>::apply(Builder& builder) {
  if (builder.type == TEXT) {
    // Coerce text to data.
    return builder.textValue.asBytes();
  }
  KJ_REQUIRE(builder.type == DATA, "Value type mismatch.") {
    return BuilderFor<Data>();
  }
  return builder.dataValue;
}